

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_sound.cpp
# Opt level: O1

bool S_ChangeMusic(char *musicname,int order,bool looping,bool force)

{
  Node *pNVar1;
  Node *pNVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  char *pcVar8;
  FString *this;
  long lVar9;
  FWadLump *this_00;
  ulong uVar10;
  ulong uVar11;
  char *pcVar12;
  MusInfo *pMVar13;
  undefined7 in_register_00000009;
  Node *pNVar14;
  Node *pNVar15;
  uint subsong;
  byte bVar16;
  MidiDeviceSetting *device;
  float rel_vol;
  FString DEH_Music;
  FString local_38;
  
  if (((int)CONCAT71(in_register_00000009,force) == 0) && (PlayList != (FPlayList *)0x0)) {
    bVar16 = 0;
    goto LAB_002faf51;
  }
  if ((musicname == (char *)0x0) ||
     (((iVar4 = strcmp(musicname,"*"), subsong = order, iVar4 == 0 &&
       (musicname = level.Music.Chars, subsong = level.musicorder, gamestate != GS_TITLELEVEL)) &&
      (gamestate != GS_LEVEL)))) {
    musicname = (char *)0x0;
    subsong = order;
  }
  if ((musicname == (char *)0x0) || (*musicname == '\0')) {
    S_StopMusic(true);
    FString::operator=(&mus_playing.name,(char *)"");
    FString::operator=(&LastSong,(char *)"");
    bVar16 = 1;
    goto LAB_002faf51;
  }
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  local_38.Chars = FString::NullString.Nothing;
  if ((*musicname == '$') &&
     (pcVar8 = FStringTable::operator[](&GStrings,musicname + 1), pcVar8 != (char *)0x0)) {
    this = FString::operator+=(&local_38,"D_");
    FString::operator+=(this,pcVar8);
    musicname = local_38.Chars;
  }
  uVar5 = FName::NameManager::FindName(&FName::NameData,musicname,false);
  pMVar13 = mus_playing.handle;
  pNVar2 = MusicAliases.Nodes + (MusicAliases.Size - 1 & uVar5);
  do {
    pNVar14 = pNVar2;
    if ((pNVar14 == (Node *)0x0) || (pNVar14->Next == (Node *)0x1)) {
      pNVar14 = (Node *)0x0;
      break;
    }
    pNVar2 = pNVar14->Next;
  } while ((pNVar14->Pair).Key.Index != uVar5);
  if (pNVar14 == (Node *)0x0) {
LAB_002fabf9:
    uVar5 = subsong;
    if (((mus_playing.handle == (MusInfo *)0x0 || *(int *)(mus_playing.name.Chars + -0xc) == 0) ||
        (iVar4 = strcasecmp(mus_playing.name.Chars,musicname), iVar4 != 0)) ||
       (pMVar13->m_Looping != looping)) {
      iVar4 = strncasecmp(musicname,",CD,",4);
      if (iVar4 == 0) {
        iVar4 = 0;
        uVar10 = strtoul(musicname + 4,(char **)0x0,0);
        pcVar8 = strchr(musicname + 4,0x2c);
        if (pcVar8 != (char *)0x0) {
          uVar11 = strtoul(pcVar8 + 1,(char **)0x0,0x10);
          iVar4 = (int)uVar11;
        }
        S_StopMusic(true);
        mus_playing.handle = I_RegisterCDSong((int)uVar10,iVar4);
      }
      else {
        uVar6 = FName::NameManager::FindName(&FName::NameData,musicname,false);
        pNVar1 = MidiDevices.Nodes + (MidiDevices.Size - 1 & uVar6);
        do {
          pNVar15 = pNVar1;
          if ((pNVar15 == (Node *)0x0) || (pNVar15->Next == (Node *)0x1)) {
            pNVar15 = (Node *)0x0;
            break;
          }
          pNVar1 = pNVar15->Next;
        } while ((pNVar15->Pair).Key.Index != uVar6);
        device = &(pNVar15->Pair).Value;
        if (pNVar15 == (Node *)0x0) {
          device = (MidiDeviceSetting *)0x0;
        }
        iVar4 = strncmp(musicname,"file://",7);
        pcVar8 = musicname + 7;
        if (iVar4 != 0) {
          pcVar8 = musicname;
        }
        bVar3 = FileExists(pcVar8);
        if (bVar3) {
          this_00 = (FWadLump *)operator_new(0x30);
          FileReader::FileReader((FileReader *)this_00,pcVar8);
          pMVar13 = (MusInfo *)0x0;
LAB_002fadac:
          S_StopMusic(true);
          if (snd_musicvolume.Value <= 0.0) {
            mus_playing.loop = looping;
            FString::operator=(&mus_playing.name,pcVar8);
            mus_playing.baseorder = subsong;
            FString::operator=(&LastSong,pcVar8);
            device = (MidiDeviceSetting *)0x1;
            if (this_00 != (FWadLump *)0x0) {
              (*(this_00->super_FileReader).super_FileReaderBase._vptr_FileReaderBase[1])(this_00);
            }
            bVar3 = false;
          }
          else {
            if (pMVar13 == (MusInfo *)0x0) {
              mus_playing.handle = I_RegisterSong(&this_00->super_FileReader,device);
            }
            else {
              mus_playing.handle = pMVar13;
              if (this_00 != (FWadLump *)0x0) {
                (*(this_00->super_FileReader).super_FileReaderBase._vptr_FileReaderBase[1])(this_00)
                ;
              }
            }
            bVar3 = true;
          }
        }
        else {
          iVar4 = FWadCollection::CheckNumForFullName(&Wads,pcVar8,true,0x10);
          if (iVar4 == -1) {
            pcVar12 = strstr(pcVar8,"://");
            if (pcVar8 < pcVar12) {
              pMVar13 = I_RegisterURLSong(pcVar8);
              if (pMVar13 != (MusInfo *)0x0) goto LAB_002fada0;
              pcVar12 = "Could not open \"%s\"\n";
            }
            else {
              pcVar12 = "Music \"%s\" not found\n";
            }
            bVar3 = false;
            Printf(pcVar12,pcVar8);
            device = (MidiDeviceSetting *)0x0;
          }
          else {
            pMVar13 = (MusInfo *)0x0;
LAB_002fada0:
            if (pMVar13 != (MusInfo *)0x0) {
              this_00 = (FWadLump *)0x0;
              goto LAB_002fadac;
            }
            iVar7 = FWadCollection::LumpLength(&Wads,iVar4);
            if (iVar7 != 0) {
              this_00 = FWadCollection::ReopenLumpNumNewFile(&Wads,iVar4);
              pMVar13 = (MusInfo *)0x0;
              if (this_00 != (FWadLump *)0x0) goto LAB_002fadac;
            }
            bVar3 = false;
            device = (MidiDeviceSetting *)0x0;
          }
        }
        bVar16 = (byte)device;
        musicname = pcVar8;
        if (!bVar3) goto LAB_002faf49;
      }
      mus_playing.loop = looping;
      FString::operator=(&mus_playing.name,musicname);
      mus_playing.baseorder = 0;
      FString::operator=(&LastSong,(char *)"");
      pMVar13 = mus_playing.handle;
      if (mus_playing.handle != (MusInfo *)0x0) {
        rel_vol = S_GetMusicVolume(musicname);
        MusInfo::Start(pMVar13,looping,rel_vol,subsong);
        goto LAB_002faf41;
      }
      bVar16 = 0;
    }
    else if (subsong == mus_playing.baseorder) {
      iVar4 = (*pMVar13->_vptr_MusInfo[8])(pMVar13);
      bVar16 = 1;
      if ((char)iVar4 == '\0') {
        (*(mus_playing.handle)->_vptr_MusInfo[4])(mus_playing.handle,looping,(ulong)subsong);
      }
    }
    else {
      iVar4 = (*pMVar13->_vptr_MusInfo[0xc])(pMVar13,(ulong)subsong);
      bVar16 = 1;
      if ((char)iVar4 != '\0') goto LAB_002faf41;
    }
  }
  else {
    lVar9 = (long)(pNVar14->Pair).Value.Index;
    uVar5 = mus_playing.baseorder;
    if (lVar9 != 0) {
      musicname = FName::NameData.NameArray[lVar9].Text;
      goto LAB_002fabf9;
    }
LAB_002faf41:
    mus_playing.baseorder = uVar5;
    bVar16 = 1;
  }
LAB_002faf49:
  FString::~FString(&local_38);
LAB_002faf51:
  return (bool)(bVar16 & 1);
}

Assistant:

bool S_ChangeMusic (const char *musicname, int order, bool looping, bool force)
{
	if (!force && PlayList)
	{ // Don't change if a playlist is active
		return false;
	}

	// allow specifying "*" as a placeholder to play the level's default music.
	if (musicname != NULL && !strcmp(musicname, "*"))
	{
		if (gamestate == GS_LEVEL || gamestate == GS_TITLELEVEL)
		{
			musicname = level.Music;
			order = level.musicorder;
		}
		else
		{
			musicname = NULL;
		}
	}

	if (musicname == NULL || musicname[0] == 0)
	{
		// Don't choke if the map doesn't have a song attached
		S_StopMusic (true);
		mus_playing.name = "";
		LastSong = "";
		return true;
	}

	FString DEH_Music;
	if (musicname[0] == '$')
	{
		// handle dehacked replacement.
		// Any music name defined this way needs to be prefixed with 'D_' because
		// Doom.exe does not contain the prefix so these strings don't either.
		const char * mus_string = GStrings[musicname+1];
		if (mus_string != NULL)
		{
			DEH_Music << "D_" << mus_string;
			musicname = DEH_Music;
		}
	}

	FName *aliasp = MusicAliases.CheckKey(musicname);
	if (aliasp != NULL) 
	{
		if (*aliasp == NAME_None)
		{
			return true;	// flagged to be ignored
		}
		musicname = aliasp->GetChars();
	}

	if (!mus_playing.name.IsEmpty() &&
		mus_playing.handle != NULL &&
		stricmp (mus_playing.name, musicname) == 0 &&
		mus_playing.handle->m_Looping == looping)
	{
		if (order != mus_playing.baseorder)
		{
			if (mus_playing.handle->SetSubsong(order))
			{
				mus_playing.baseorder = order;
			}
		}
		else if (!mus_playing.handle->IsPlaying())
		{
			mus_playing.handle->Play(looping, order);
		}
		return true;
	}

	if (strnicmp (musicname, ",CD,", 4) == 0)
	{
		int track = strtoul (musicname+4, NULL, 0);
		const char *more = strchr (musicname+4, ',');
		unsigned int id = 0;

		if (more != NULL)
		{
			id = strtoul (more+1, NULL, 16);
		}
		S_StopMusic (true);
		mus_playing.handle = I_RegisterCDSong (track, id);
	}
	else
	{
		int lumpnum = -1;
		int length = 0;
		MusInfo *handle = NULL;
		MidiDeviceSetting *devp = MidiDevices.CheckKey(musicname);

		// Strip off any leading file:// component.
		if (strncmp(musicname, "file://", 7) == 0)
		{
			musicname += 7;
		}

		FileReader *reader = NULL;
		if (!FileExists (musicname))
		{
			if ((lumpnum = Wads.CheckNumForFullName (musicname, true, ns_music)) == -1)
			{
				if (strstr(musicname, "://") > musicname)
				{
					// Looks like a URL; try it as such.
					handle = I_RegisterURLSong(musicname);
					if (handle == NULL)
					{
						Printf ("Could not open \"%s\"\n", musicname);
						return false;
					}
				}
				else
				{
					Printf ("Music \"%s\" not found\n", musicname);
					return false;
				}
			}
			if (handle == NULL)
			{
				if (Wads.LumpLength (lumpnum) == 0)
				{
					return false;
				}
				reader = Wads.ReopenLumpNumNewFile(lumpnum);
				if (reader == NULL)
				{
					return false;
				}
			}
		}
		else
		{
			// Load an external file.
			reader = new FileReader(musicname);
		}

		// shutdown old music
		S_StopMusic (true);

		// Just record it if volume is 0
		if (snd_musicvolume <= 0)
		{
			mus_playing.loop = looping;
			mus_playing.name = musicname;
			mus_playing.baseorder = order;
			LastSong = musicname;
			delete reader;
			return true;
		}

		// load & register it
		if (handle != NULL)
		{
			mus_playing.handle = handle;
			delete reader;
		}
		else
		{
			mus_playing.handle = I_RegisterSong (reader, devp);
		}
	}

	mus_playing.loop = looping;
	mus_playing.name = musicname;
	mus_playing.baseorder = 0;
	LastSong = "";

	if (mus_playing.handle != 0)
	{ // play it
		mus_playing.handle->Start(looping, S_GetMusicVolume (musicname), order);
		mus_playing.baseorder = order;
		return true;
	}
	return false;
}